

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

BigNum * operator+(BigNum *__return_storage_ptr__,BigNum *a,BigNum *b)

{
  int iVar1;
  reference pvVar2;
  BigNum local_190;
  BigNum local_170;
  BigNum local_150;
  BigNum local_130;
  BigNum local_110;
  BigNum local_f0;
  BigNum local_d0;
  BigNum local_b0;
  BigNum local_90;
  BigNum local_70;
  int local_4c;
  int local_48;
  int sum;
  int i_2;
  int i_1;
  value_type local_30;
  int local_2c;
  value_type local_28;
  int i;
  int rest;
  BigNum *b_local;
  BigNum *a_local;
  BigNum *c;
  
  i._3_1_ = 0;
  _rest = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  BigNum::BigNum(__return_storage_ptr__);
  local_28 = 0;
  if ((a->sign & 1U) == (b->sign & 1U)) {
    if (a->length < b->length) {
      for (local_2c = 0; local_2c < b->length - a->length; local_2c = local_2c + 1) {
        local_30 = 0;
        std::vector<int,_std::allocator<int>_>::push_back(&a->digits,&local_30);
      }
      a->length = b->length;
    }
    if (b->length < a->length) {
      for (i_2 = 0; i_2 < a->length - b->length; i_2 = i_2 + 1) {
        sum = 0;
        std::vector<int,_std::allocator<int>_>::push_back(&b->digits,&sum);
      }
      b->length = a->length;
    }
    for (local_48 = 0; local_48 < a->length; local_48 = local_48 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&a->digits,(long)local_48);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&b->digits,(long)local_48);
      local_4c = (iVar1 + *pvVar2 + local_28) % 10;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&a->digits,(long)local_48);
      iVar1 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&b->digits,(long)local_48);
      local_28 = (iVar1 + *pvVar2 + local_28) / 10;
      std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->digits,&local_4c);
    }
    __return_storage_ptr__->sign = (bool)(a->sign & 1);
    __return_storage_ptr__->length = a->length;
    if (0 < local_28) {
      std::vector<int,_std::allocator<int>_>::push_back(&__return_storage_ptr__->digits,&local_28);
      __return_storage_ptr__->length = __return_storage_ptr__->length + 1;
    }
  }
  else if ((a->sign & 1U) == 0) {
    BigNum::BigNum(&local_150,b);
    abs((int)&local_130);
    BigNum::BigNum(&local_190,a);
    abs((int)&local_170);
    operator-(&local_110,&local_130,&local_170);
    BigNum::operator=(__return_storage_ptr__,&local_110);
    BigNum::~BigNum(&local_110);
    BigNum::~BigNum(&local_170);
    BigNum::~BigNum(&local_190);
    BigNum::~BigNum(&local_130);
    BigNum::~BigNum(&local_150);
  }
  else {
    BigNum::BigNum(&local_b0,a);
    abs((int)&local_90);
    BigNum::BigNum(&local_f0,b);
    abs((int)&local_d0);
    operator-(&local_70,&local_90,&local_d0);
    BigNum::operator=(__return_storage_ptr__,&local_70);
    BigNum::~BigNum(&local_70);
    BigNum::~BigNum(&local_d0);
    BigNum::~BigNum(&local_f0);
    BigNum::~BigNum(&local_90);
    BigNum::~BigNum(&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNum operator +(BigNum a, BigNum b){
    BigNum c = BigNum();
    int rest = 0;
    if (a.sign == b.sign) {
        if (a.length < b.length) {
            for (int i = 0; i < b.length - a.length; i++) {
                a.digits.push_back(0);
            }
            a.length = b.length;
        }
        if (b.length < a.length) {
            for (int i = 0; i < a.length - b.length; i++) {
                b.digits.push_back(0);
            }
            b.length = a.length;
        }
        for (int i = 0; i < a.length; i++) {
            int sum = (a.digits[i] + b.digits[i] + rest) % 10;
            rest = (a.digits[i] + b.digits[i] + rest) / 10;
            c.digits.push_back(sum);
        }
        c.sign = a.sign;
        c.length = a.length;
        if (rest > 0) {
            c.digits.push_back(rest);
            c.length++;
        }
    }
    else {
        if (a.sign){
            c = abs(a) - abs(b);
        }
        else {
            c = abs(b) - abs(a);
        }

    }
    return c;
}